

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::InstancedRenderingCase::iterate(InstancedRenderingCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 seed;
  int y;
  RenderTarget *pRVar5;
  char *str;
  RenderContext *context;
  TestLog *log;
  char *local_f0;
  undefined1 local_a0 [7];
  bool testOk;
  undefined1 local_78 [8];
  Surface resultImg;
  Surface referenceImg;
  int yOffset;
  undefined1 local_30 [4];
  int xOffset;
  Random rnd;
  int yOffsetMax;
  int xOffsetMax;
  int height;
  int width;
  InstancedRenderingCase *this_local;
  
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar5);
  iVar2 = ::deMin32(iVar2,0x80);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getHeight(pRVar5);
  iVar3 = ::deMin32(iVar3,0x80);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar5);
  rnd.m_rnd.w = iVar4 - iVar2;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar5);
  rnd.m_rnd.z = iVar4 - iVar3;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)local_30,seed);
  iVar4 = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.w);
  y = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.z);
  tcu::Surface::Surface((Surface *)&resultImg.m_pixels.m_cap,iVar2,iVar3);
  tcu::Surface::Surface((Surface *)local_78,iVar2,iVar3);
  glwViewport(iVar4,y,iVar2,iVar3);
  setupAndRender(this);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_a0,(Surface *)local_78);
  glu::readPixels(context,iVar4,y,(PixelBufferAccess *)local_a0);
  computeReference(this,(Surface *)&resultImg.m_pixels.m_cap);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",
                            (Surface *)&resultImg.m_pixels.m_cap,(Surface *)local_78,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar1) {
    local_f0 = "Pass";
  }
  else {
    local_f0 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,local_f0);
  tcu::Surface::~Surface((Surface *)local_78);
  tcu::Surface::~Surface((Surface *)&resultImg.m_pixels.m_cap);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

InstancedRenderingCase::IterateResult InstancedRenderingCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	// Draw result.

	glViewport(xOffset, yOffset, width, height);

	setupAndRender();

	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Compute reference.

	computeReference(referenceImg);

	// Compare.

	bool testOk = tcu::fuzzyCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, 0.05f, tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	return STOP;
}